

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy_extDict_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  U32 UVar2;
  U32 *pUVar3;
  seqDef *psVar4;
  bool bVar5;
  char cVar6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  BYTE *pBVar13;
  byte bVar14;
  uint uVar15;
  BYTE *pBVar16;
  int *piVar17;
  uint uVar18;
  U32 UVar19;
  char *pcVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  int *piVar27;
  uint uVar28;
  int *piVar29;
  ulong uVar30;
  uint uVar31;
  long lVar32;
  size_t ofbCandidate;
  U32 maxDistance;
  size_t local_108;
  uint local_fc;
  int *local_f8;
  ZSTD_matchState_t *local_f0;
  int *local_e8;
  BYTE *local_e0;
  uint local_d8;
  int local_d4;
  uint local_d0;
  uint local_cc;
  int *local_c8;
  ulong local_c0;
  ulong local_b8;
  seqStore_t *local_b0;
  ulong local_a8;
  BYTE *local_a0;
  int *local_98;
  BYTE *local_90;
  int *local_88;
  BYTE *local_80;
  int *local_78;
  U32 *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_e0 = (ms->window).base;
  local_a0 = (ms->window).dictBase;
  uVar15 = (ms->window).dictLimit;
  local_c0 = (ulong)uVar15;
  local_80 = (BYTE *)(ulong)(ms->window).lowLimit;
  uVar8 = (ms->cParams).windowLog;
  local_e8 = (int *)CONCAT44(local_e8._4_4_,uVar8);
  local_cc = (ms->cParams).minMatch;
  if (5 < local_cc) {
    local_cc = 6;
  }
  if (local_cc < 5) {
    local_cc = 4;
  }
  local_d0 = (ms->cParams).searchLog;
  local_fc = 6;
  if (local_d0 < 6) {
    local_fc = local_d0;
  }
  if (local_fc < 5) {
    local_fc = 4;
  }
  uVar12 = (ulong)*rep;
  uVar28 = rep[1];
  ms->lazySkipping = 0;
  local_90 = local_e0 + local_c0;
  local_a8 = CONCAT71(local_a8._1_7_,local_90 == (BYTE *)src);
  local_98 = (int *)((long)src + (srcSize - 0x10));
  uVar31 = ms->nextToUpdate;
  uVar24 = (ulong)uVar31;
  uVar18 = ((int)local_98 - (int)(local_e0 + uVar24)) + 1;
  uVar21 = 8;
  if (uVar18 < 8) {
    uVar21 = uVar18;
  }
  if (local_98 < local_e0 + uVar24) {
    uVar21 = 0;
  }
  bVar14 = (byte)local_fc;
  local_f0 = ms;
  local_d8 = uVar28;
  local_c8 = (int *)src;
  local_b8 = uVar12;
  local_b0 = seqStore;
  local_70 = rep;
  if (uVar31 < uVar21 + uVar31) {
    local_f8 = (int *)srcSize;
    if (0x20 < ms->rowHashLog + 8) {
LAB_00166136:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    pUVar3 = ms->hashTable;
    pBVar16 = ms->tagTable;
    uVar30 = ms->hashSalt;
    cVar6 = (char)ms->rowHashLog;
    do {
      if (local_cc == 5) {
        uVar10 = *(long *)(local_e0 + uVar24) * -0x30e4432345000000;
LAB_00165550:
        uVar18 = (uint)((uVar10 ^ uVar30) >> (0x38U - cVar6 & 0x3f));
      }
      else {
        if (local_cc == 6) {
          uVar10 = *(long *)(local_e0 + uVar24) * -0x30e4432340650000;
          goto LAB_00165550;
        }
        uVar18 = (*(int *)(local_e0 + uVar24) * -0x61c8864f ^ (uint)uVar30) >>
                 (0x18U - cVar6 & 0x1f);
      }
      uVar22 = (uVar18 >> 8) << (bVar14 & 0x1f);
      if (((ulong)(pUVar3 + uVar22) & 0x3f) != 0) {
LAB_0016603e:
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a2,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      if (((ulong)(pBVar16 + uVar22) & ~(-1L << (bVar14 & 0x3f))) != 0) {
LAB_0016601f:
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a3,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      ms->hashCache[(uint)uVar24 & 7] = uVar18;
      uVar24 = uVar24 + 1;
    } while (uVar21 + uVar31 != uVar24);
  }
  piVar29 = (int *)(srcSize + (long)src);
  piVar27 = (int *)((ulong)(local_90 == (BYTE *)src) + (long)src);
  if (piVar27 < local_98) {
    local_88 = (int *)(local_a0 + local_c0);
    local_80 = local_80 + (long)local_a0;
    uVar8 = 1 << ((byte)uVar8 & 0x1f);
    local_a8 = (ulong)uVar8;
    iVar25 = uVar15 - 1;
    local_78 = piVar29 + -8;
    local_50 = ~(-1L << (bVar14 & 0x3f));
    iVar9 = (int)local_e0;
    local_60 = (ulong)(1 - (uVar8 + iVar9));
    local_58 = (ulong)(1 - iVar9);
    local_68 = (ulong)((uVar15 + iVar9) - 2);
    uVar24 = (ulong)uVar28;
    local_f8 = piVar29;
    local_d4 = iVar25;
    do {
      iVar26 = (int)piVar27;
      iVar9 = (iVar26 - (int)local_e0) + 1;
      UVar2 = (ms->window).lowLimit;
      UVar19 = iVar9 - (uint)local_a8;
      if (iVar9 - UVar2 <= (uint)local_a8) {
        UVar19 = UVar2;
      }
      if (ms->loadedDictEnd != 0) {
        UVar19 = UVar2;
      }
      uVar8 = (uint)uVar12;
      uVar15 = iVar9 - uVar8;
      pBVar16 = local_e0;
      if (uVar15 < (uint)local_c0) {
        pBVar16 = local_a0;
      }
      local_e8 = (int *)((long)piVar27 + 1);
      if (iVar25 - uVar15 < 3) {
LAB_00165748:
        uVar30 = 0;
      }
      else {
        uVar30 = 0;
        if (uVar8 <= iVar9 - UVar19) {
          if (*local_e8 != *(int *)(pBVar16 + uVar15)) goto LAB_00165748;
          piVar17 = piVar29;
          if (uVar15 < (uint)local_c0) {
            piVar17 = local_88;
          }
          sVar11 = ZSTD_count_2segments
                             ((BYTE *)((long)piVar27 + 5),(BYTE *)((long)(pBVar16 + uVar15) + 4),
                              (BYTE *)piVar29,(BYTE *)piVar17,local_90);
          uVar30 = sVar11 + 4;
        }
      }
      local_108 = 999999999;
      local_d8 = (uint)uVar24;
      if (local_cc == 6) {
        if (local_fc == 6) {
          uVar24 = ZSTD_RowFindBestMatch_extDict_6_6(ms,(BYTE *)piVar27,(BYTE *)piVar29,&local_108);
        }
        else if (local_fc == 5) {
          uVar24 = ZSTD_RowFindBestMatch_extDict_6_5(ms,(BYTE *)piVar27,(BYTE *)piVar29,&local_108);
        }
        else {
          uVar24 = ZSTD_RowFindBestMatch_extDict_6_4(ms,(BYTE *)piVar27,(BYTE *)piVar29,&local_108);
        }
      }
      else if (local_cc == 5) {
        if (local_fc == 6) {
          uVar24 = ZSTD_RowFindBestMatch_extDict_5_6(ms,(BYTE *)piVar27,(BYTE *)piVar29,&local_108);
        }
        else if (local_fc == 5) {
          uVar24 = ZSTD_RowFindBestMatch_extDict_5_5(ms,(BYTE *)piVar27,(BYTE *)piVar29,&local_108);
        }
        else {
          uVar24 = ZSTD_RowFindBestMatch_extDict_5_4(ms,(BYTE *)piVar27,(BYTE *)piVar29,&local_108);
        }
      }
      else if (local_fc == 6) {
        uVar24 = ZSTD_RowFindBestMatch_extDict_4_6(ms,(BYTE *)piVar27,(BYTE *)piVar29,&local_108);
      }
      else if (local_fc == 5) {
        uVar24 = ZSTD_RowFindBestMatch_extDict_4_5(ms,(BYTE *)piVar27,(BYTE *)piVar29,&local_108);
      }
      else {
        uVar24 = ZSTD_RowFindBestMatch_extDict_4_4(ms,(BYTE *)piVar27,(BYTE *)piVar29,&local_108);
      }
      uVar10 = uVar30;
      if (uVar30 < uVar24) {
        uVar10 = uVar24;
      }
      if (uVar10 < 4) {
        uVar24 = (long)piVar27 - (long)local_c8;
        piVar27 = (int *)((long)piVar27 + (uVar24 >> 8) + 1);
        ms->lazySkipping = (uint)(0x8ff < uVar24);
        uVar24 = (ulong)local_d8;
        iVar25 = local_d4;
      }
      else {
        piVar29 = piVar27;
        uVar23 = local_108;
        if (uVar24 <= uVar30) {
          piVar29 = local_e8;
          uVar23 = 1;
        }
        local_38 = (ulong)(uint)((int)local_60 + iVar26);
        uVar15 = (int)local_58 + iVar26;
        local_40 = (ulong)uVar15;
        uVar28 = ((int)local_68 + uVar8) - iVar26;
        local_48 = (ulong)(uVar15 - uVar8);
        lVar32 = 0;
        local_e8 = piVar29;
        local_b8 = uVar12;
        do {
          if (local_98 <= (int *)((long)piVar27 + lVar32)) break;
          piVar29 = (int *)((long)piVar27 + lVar32 + 1);
          if (uVar23 == 0) {
            uVar23 = 0;
          }
          else {
            UVar2 = (local_f0->window).lowLimit;
            iVar9 = (int)lVar32;
            iVar25 = (int)local_40 + iVar9;
            UVar19 = (int)local_38 + iVar9;
            if (iVar25 - UVar2 <= (uint)local_a8) {
              UVar19 = UVar2;
            }
            if (local_f0->loadedDictEnd != 0) {
              UVar19 = UVar2;
            }
            uVar15 = (int)local_48 + iVar9;
            pBVar16 = local_e0;
            if (uVar15 < (uint)local_c0) {
              pBVar16 = local_a0;
            }
            if (((2 < uVar28) && ((uint)local_b8 <= iVar25 - UVar19)) &&
               (*piVar29 == *(int *)(pBVar16 + uVar15))) {
              piVar17 = local_f8;
              if (uVar15 < (uint)local_c0) {
                piVar17 = local_88;
              }
              sVar11 = ZSTD_count_2segments
                                 ((BYTE *)((long)piVar27 + lVar32 + 5),
                                  (BYTE *)((long)(pBVar16 + uVar15) + 4),(BYTE *)local_f8,
                                  (BYTE *)piVar17,local_90);
              if (sVar11 < 0xfffffffffffffffc) {
                uVar15 = 0x1f;
                if ((uint)uVar23 != 0) {
                  for (; (uint)uVar23 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                  }
                }
                if ((int)((uVar15 ^ 0x1f) + (int)uVar10 * 3 + -0x1e) < (int)(sVar11 + 4) * 3) {
                  uVar23 = 1;
                  uVar10 = sVar11 + 4;
                  local_e8 = piVar29;
                }
              }
            }
          }
          local_108 = 999999999;
          if (local_cc == 6) {
            if (local_fc == 6) {
              uVar12 = ZSTD_RowFindBestMatch_extDict_6_6
                                 (local_f0,(BYTE *)piVar29,(BYTE *)local_f8,&local_108);
            }
            else if (local_fc == 5) {
              uVar12 = ZSTD_RowFindBestMatch_extDict_6_5
                                 (local_f0,(BYTE *)piVar29,(BYTE *)local_f8,&local_108);
            }
            else {
              uVar12 = ZSTD_RowFindBestMatch_extDict_6_4
                                 (local_f0,(BYTE *)piVar29,(BYTE *)local_f8,&local_108);
            }
          }
          else if (local_cc == 5) {
            if (local_fc == 6) {
              uVar12 = ZSTD_RowFindBestMatch_extDict_5_6
                                 (local_f0,(BYTE *)piVar29,(BYTE *)local_f8,&local_108);
            }
            else if (local_fc == 5) {
              uVar12 = ZSTD_RowFindBestMatch_extDict_5_5
                                 (local_f0,(BYTE *)piVar29,(BYTE *)local_f8,&local_108);
            }
            else {
              uVar12 = ZSTD_RowFindBestMatch_extDict_5_4
                                 (local_f0,(BYTE *)piVar29,(BYTE *)local_f8,&local_108);
            }
          }
          else if (local_fc == 6) {
            uVar12 = ZSTD_RowFindBestMatch_extDict_4_6
                               (local_f0,(BYTE *)piVar29,(BYTE *)local_f8,&local_108);
          }
          else if (local_fc == 5) {
            uVar12 = ZSTD_RowFindBestMatch_extDict_4_5
                               (local_f0,(BYTE *)piVar29,(BYTE *)local_f8,&local_108);
          }
          else {
            uVar12 = ZSTD_RowFindBestMatch_extDict_4_4
                               (local_f0,(BYTE *)piVar29,(BYTE *)local_f8,&local_108);
          }
          bVar5 = true;
          if (3 < uVar12) {
            uVar15 = 0x1f;
            if ((uint)uVar23 != 0) {
              for (; (uint)uVar23 >> uVar15 == 0; uVar15 = uVar15 - 1) {
              }
            }
            iVar25 = 0x1f;
            if ((uint)local_108 != 0) {
              for (; (uint)local_108 >> iVar25 == 0; iVar25 = iVar25 + -1) {
              }
            }
            if ((int)((uVar15 ^ 0x1f) + (int)uVar10 * 4 + -0x1b) < (int)uVar12 * 4 - iVar25) {
              bVar5 = false;
              uVar10 = uVar12;
              uVar23 = local_108;
              local_e8 = piVar29;
            }
          }
          lVar32 = lVar32 + 1;
          uVar28 = uVar28 - 1;
        } while (!bVar5);
        piVar29 = local_f8;
        if (uVar23 < 4) {
          uVar30 = (ulong)local_d8;
        }
        else {
          pcVar20 = (char *)((long)local_e8 + (3 - (long)(local_e0 + uVar23)));
          pBVar13 = local_90;
          pBVar16 = local_e0;
          if ((uint)pcVar20 < (uint)local_c0) {
            pBVar13 = local_80;
            pBVar16 = local_a0;
          }
          if ((local_c8 < local_e8) &&
             (uVar12 = (ulong)pcVar20 & 0xffffffff, pBVar13 < pBVar16 + uVar12)) {
            pBVar16 = pBVar16 + uVar12;
            do {
              piVar27 = (int *)((long)local_e8 + -1);
              pBVar16 = pBVar16 + -1;
              if ((*(BYTE *)piVar27 != *pBVar16) ||
                 (uVar10 = uVar10 + 1, local_e8 = piVar27, piVar27 <= local_c8)) break;
            } while (pBVar13 < pBVar16);
          }
          uVar30 = local_b8 & 0xffffffff;
          local_b8 = (ulong)((U32)uVar23 - 3);
        }
        if (local_b0->maxNbSeq <=
            (ulong)((long)local_b0->sequences - (long)local_b0->sequencesStart >> 3)) {
LAB_0016605d:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_b0->maxNbLit) {
LAB_0016607c:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar12 = (long)local_e8 - (long)local_c8;
        pBVar16 = local_b0->lit;
        if (local_b0->litStart + local_b0->maxNbLit < pBVar16 + uVar12) {
LAB_001660d9:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_f8 < local_e8) {
LAB_001660ba:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_78 < local_e8) {
          ZSTD_safecopyLiterals(pBVar16,(BYTE *)local_c8,(BYTE *)local_e8,(BYTE *)local_78);
        }
        else {
          uVar7 = *(undefined8 *)(local_c8 + 2);
          *(undefined8 *)pBVar16 = *(undefined8 *)local_c8;
          *(undefined8 *)(pBVar16 + 8) = uVar7;
          if (0x10 < uVar12) {
            pBVar16 = local_b0->lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar16 + 0x10 + (-0x10 - (long)(local_c8 + 4))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar7 = *(undefined8 *)(local_c8 + 6);
            *(undefined8 *)(pBVar16 + 0x10) = *(undefined8 *)(local_c8 + 4);
            *(undefined8 *)(pBVar16 + 0x18) = uVar7;
            if (0x20 < (long)uVar12) {
              lVar32 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_c8 + lVar32 + 0x20);
                uVar7 = puVar1[1];
                pBVar13 = pBVar16 + lVar32 + 0x20;
                *(undefined8 *)pBVar13 = *puVar1;
                *(undefined8 *)(pBVar13 + 8) = uVar7;
                puVar1 = (undefined8 *)((long)local_c8 + lVar32 + 0x30);
                uVar7 = puVar1[1];
                *(undefined8 *)(pBVar13 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar13 + 0x18) = uVar7;
                lVar32 = lVar32 + 0x20;
              } while (pBVar13 + 0x20 < pBVar16 + uVar12);
            }
          }
        }
        ms = local_f0;
        local_b0->lit = local_b0->lit + uVar12;
        if (0xffff < uVar12) {
          if (local_b0->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_b0->longLengthType = ZSTD_llt_literalLength;
          local_b0->longLengthPos =
               (U32)((ulong)((long)local_b0->sequences - (long)local_b0->sequencesStart) >> 3);
        }
        psVar4 = local_b0->sequences;
        psVar4->litLength = (U16)uVar12;
        psVar4->offBase = (U32)uVar23;
        if (uVar10 < 3) {
LAB_0016609b:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar10 - 3) {
          if (local_b0->longLengthType != ZSTD_llt_none) {
LAB_001660f8:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_b0->longLengthType = ZSTD_llt_matchLength;
          local_b0->longLengthPos =
               (U32)((ulong)((long)psVar4 - (long)local_b0->sequencesStart) >> 3);
        }
        psVar4->mlBase = (U16)(uVar10 - 3);
        local_b0->sequences = psVar4 + 1;
        if (local_f0->lazySkipping != 0) {
          uVar15 = local_f0->nextToUpdate;
          uVar12 = (ulong)uVar15;
          uVar8 = ((int)local_98 - (int)(local_e0 + uVar12)) + 1;
          if (7 < uVar8) {
            uVar8 = 8;
          }
          if (local_98 < local_e0 + uVar12) {
            uVar8 = 0;
          }
          if (uVar15 < uVar8 + uVar15) {
            if (0x20 < local_f0->rowHashLog + 8) goto LAB_00166136;
            pUVar3 = local_f0->hashTable;
            pBVar16 = local_f0->tagTable;
            uVar24 = local_f0->hashSalt;
            cVar6 = (char)local_f0->rowHashLog;
            do {
              if (local_cc == 5) {
                uVar23 = *(long *)(local_e0 + uVar12) * -0x30e4432345000000;
LAB_00165db6:
                uVar28 = (uint)((uVar23 ^ uVar24) >> (0x38U - cVar6 & 0x3f));
              }
              else {
                if (local_cc == 6) {
                  uVar23 = *(long *)(local_e0 + uVar12) * -0x30e4432340650000;
                  goto LAB_00165db6;
                }
                uVar28 = (*(int *)(local_e0 + uVar12) * -0x61c8864f ^ (uint)uVar24) >>
                         (0x18U - cVar6 & 0x1f);
              }
              uVar31 = (uVar28 >> 8) << ((byte)local_fc & 0x1f);
              if (((ulong)(pUVar3 + uVar31) & 0x3f) != 0) goto LAB_0016603e;
              if ((local_50 & (ulong)(pBVar16 + uVar31)) != 0) goto LAB_0016601f;
              local_f0->hashCache[(uint)uVar12 & 7] = uVar28;
              uVar12 = uVar12 + 1;
            } while (uVar8 + uVar15 != uVar12);
          }
          local_f0->lazySkipping = 0;
        }
        piVar27 = (int *)((long)local_e8 + uVar10);
        uVar12 = local_b8;
        iVar25 = local_d4;
        local_c8 = piVar27;
        do {
          uVar24 = uVar30;
          if (local_98 < piVar27) break;
          iVar9 = (int)piVar27 - (int)local_e0;
          UVar2 = (ms->window).lowLimit;
          UVar19 = iVar9 - (uint)local_a8;
          if (iVar9 - UVar2 <= (uint)local_a8) {
            UVar19 = UVar2;
          }
          if (ms->loadedDictEnd != 0) {
            UVar19 = UVar2;
          }
          uVar15 = iVar9 - (uint)uVar30;
          pBVar16 = local_e0;
          if (uVar15 < (uint)local_c0) {
            pBVar16 = local_a0;
          }
          if (((iVar25 - uVar15 < 3) || (iVar9 - UVar19 < (uint)uVar30)) ||
             (*piVar27 != *(int *)(pBVar16 + uVar15))) {
            bVar5 = false;
            uVar30 = uVar12 & 0xffffffff;
          }
          else {
            piVar17 = piVar29;
            if (uVar15 < (uint)local_c0) {
              piVar17 = local_88;
            }
            sVar11 = ZSTD_count_2segments
                               ((BYTE *)(piVar27 + 1),(BYTE *)((long)(pBVar16 + uVar15) + 4),
                                (BYTE *)piVar29,(BYTE *)piVar17,local_90);
            if (local_b0->maxNbSeq <=
                (ulong)((long)local_b0->sequences - (long)local_b0->sequencesStart >> 3))
            goto LAB_0016605d;
            if (0x20000 < local_b0->maxNbLit) goto LAB_0016607c;
            pBVar16 = local_b0->lit;
            if (local_b0->litStart + local_b0->maxNbLit < pBVar16) goto LAB_001660d9;
            if (piVar29 < local_c8) goto LAB_001660ba;
            if (local_78 < local_c8) {
              ZSTD_safecopyLiterals(pBVar16,(BYTE *)local_c8,(BYTE *)local_c8,(BYTE *)local_78);
            }
            else {
              uVar7 = *(undefined8 *)(local_c8 + 2);
              *(undefined8 *)pBVar16 = *(undefined8 *)local_c8;
              *(undefined8 *)(pBVar16 + 8) = uVar7;
            }
            psVar4 = local_b0->sequences;
            psVar4->litLength = 0;
            psVar4->offBase = 1;
            if (sVar11 + 4 < 3) goto LAB_0016609b;
            if (0xffff < sVar11 + 1) {
              if (local_b0->longLengthType != ZSTD_llt_none) goto LAB_001660f8;
              local_b0->longLengthType = ZSTD_llt_matchLength;
              local_b0->longLengthPos =
                   (U32)((ulong)((long)psVar4 - (long)local_b0->sequencesStart) >> 3);
            }
            psVar4->mlBase = (U16)(sVar11 + 1);
            local_b0->sequences = psVar4 + 1;
            piVar27 = (int *)((long)piVar27 + sVar11 + 4);
            bVar5 = true;
            uVar24 = uVar12;
            iVar25 = local_d4;
            local_c8 = piVar27;
          }
          uVar12 = uVar30;
          uVar30 = uVar24 & 0xffffffff;
        } while (bVar5);
      }
      uVar28 = (uint)uVar24;
    } while (piVar27 < local_98);
  }
  *local_70 = (U32)uVar12;
  local_70[1] = uVar28;
  return (long)piVar29 - (long)local_c8;
}

Assistant:

FORCE_INLINE_TEMPLATE
size_t ZSTD_compressBlock_lazy_extDict_generic(
                        ZSTD_matchState_t* ms, seqStore_t* seqStore,
                        U32 rep[ZSTD_REP_NUM],
                        const void* src, size_t srcSize,
                        const searchMethod_e searchMethod, const U32 depth)
{
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = searchMethod == search_rowHash ? iend - 8 - ZSTD_ROW_HASH_CACHE_SIZE : iend - 8;
    const BYTE* const base = ms->window.base;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const dictEnd  = dictBase + dictLimit;
    const BYTE* const dictStart  = dictBase + ms->window.lowLimit;
    const U32 windowLog = ms->cParams.windowLog;
    const U32 mls = BOUNDED(4, ms->cParams.minMatch, 6);
    const U32 rowLog = BOUNDED(4, ms->cParams.searchLog, 6);

    U32 offset_1 = rep[0], offset_2 = rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_lazy_extDict_generic (searchFunc=%u)", (U32)searchMethod);

    /* Reset the lazy skipping state */
    ms->lazySkipping = 0;

    /* init */
    ip += (ip == prefixStart);
    if (searchMethod == search_rowHash) {
        ZSTD_row_fillHashCache(ms, base, rowLog, mls, ms->nextToUpdate, ilimit);
    }

    /* Match Loop */
#if defined(__GNUC__) && defined(__x86_64__)
    /* I've measured random a 5% speed loss on levels 5 & 6 (greedy) when the
     * code alignment is perturbed. To fix the instability align the loop on 32-bytes.
     */
    __asm__(".p2align 5");
#endif
    while (ip < ilimit) {
        size_t matchLength=0;
        size_t offBase = REPCODE1_TO_OFFBASE;
        const BYTE* start=ip+1;
        U32 curr = (U32)(ip-base);

        /* check repCode */
        {   const U32 windowLow = ZSTD_getLowestMatchIndex(ms, curr+1, windowLog);
            const U32 repIndex = (U32)(curr+1 - offset_1);
            const BYTE* const repBase = repIndex < dictLimit ? dictBase : base;
            const BYTE* const repMatch = repBase + repIndex;
            if ( ((U32)((dictLimit-1) - repIndex) >= 3) /* intentional overflow */
               & (offset_1 <= curr+1 - windowLow) ) /* note: we are searching at curr+1 */
            if (MEM_read32(ip+1) == MEM_read32(repMatch)) {
                /* repcode detected we should take it */
                const BYTE* const repEnd = repIndex < dictLimit ? dictEnd : iend;
                matchLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repEnd, prefixStart) + 4;
                if (depth==0) goto _storeSequence;
        }   }

        /* first search (depth 0) */
        {   size_t ofbCandidate = 999999999;
            size_t const ml2 = ZSTD_searchMax(ms, ip, iend, &ofbCandidate, mls, rowLog, searchMethod, ZSTD_extDict);
            if (ml2 > matchLength)
                matchLength = ml2, start = ip, offBase = ofbCandidate;
        }

        if (matchLength < 4) {
            size_t const step = ((size_t)(ip-anchor) >> kSearchStrength);
            ip += step + 1;   /* jump faster over incompressible sections */
            /* Enter the lazy skipping mode once we are skipping more than 8 bytes at a time.
             * In this mode we stop inserting every position into our tables, and only insert
             * positions that we search, which is one in step positions.
             * The exact cutoff is flexible, I've just chosen a number that is reasonably high,
             * so we minimize the compression ratio loss in "normal" scenarios. This mode gets
             * triggered once we've gone 2KB without finding any matches.
             */
            ms->lazySkipping = step > kLazySkippingStep;
            continue;
        }

        /* let's try to find a better solution */
        if (depth>=1)
        while (ip<ilimit) {
            ip ++;
            curr++;
            /* check repCode */
            if (offBase) {
                const U32 windowLow = ZSTD_getLowestMatchIndex(ms, curr, windowLog);
                const U32 repIndex = (U32)(curr - offset_1);
                const BYTE* const repBase = repIndex < dictLimit ? dictBase : base;
                const BYTE* const repMatch = repBase + repIndex;
                if ( ((U32)((dictLimit-1) - repIndex) >= 3) /* intentional overflow : do not test positions overlapping 2 memory segments  */
                   & (offset_1 <= curr - windowLow) ) /* equivalent to `curr > repIndex >= windowLow` */
                if (MEM_read32(ip) == MEM_read32(repMatch)) {
                    /* repcode detected */
                    const BYTE* const repEnd = repIndex < dictLimit ? dictEnd : iend;
                    size_t const repLength = ZSTD_count_2segments(ip+4, repMatch+4, iend, repEnd, prefixStart) + 4;
                    int const gain2 = (int)(repLength * 3);
                    int const gain1 = (int)(matchLength*3 - ZSTD_highbit32((U32)offBase) + 1);
                    if ((repLength >= 4) && (gain2 > gain1))
                        matchLength = repLength, offBase = REPCODE1_TO_OFFBASE, start = ip;
            }   }

            /* search match, depth 1 */
            {   size_t ofbCandidate = 999999999;
                size_t const ml2 = ZSTD_searchMax(ms, ip, iend, &ofbCandidate, mls, rowLog, searchMethod, ZSTD_extDict);
                int const gain2 = (int)(ml2*4 - ZSTD_highbit32((U32)ofbCandidate));   /* raw approx */
                int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offBase) + 4);
                if ((ml2 >= 4) && (gain2 > gain1)) {
                    matchLength = ml2, offBase = ofbCandidate, start = ip;
                    continue;   /* search a better one */
            }   }

            /* let's find an even better one */
            if ((depth==2) && (ip<ilimit)) {
                ip ++;
                curr++;
                /* check repCode */
                if (offBase) {
                    const U32 windowLow = ZSTD_getLowestMatchIndex(ms, curr, windowLog);
                    const U32 repIndex = (U32)(curr - offset_1);
                    const BYTE* const repBase = repIndex < dictLimit ? dictBase : base;
                    const BYTE* const repMatch = repBase + repIndex;
                    if ( ((U32)((dictLimit-1) - repIndex) >= 3) /* intentional overflow : do not test positions overlapping 2 memory segments  */
                       & (offset_1 <= curr - windowLow) ) /* equivalent to `curr > repIndex >= windowLow` */
                    if (MEM_read32(ip) == MEM_read32(repMatch)) {
                        /* repcode detected */
                        const BYTE* const repEnd = repIndex < dictLimit ? dictEnd : iend;
                        size_t const repLength = ZSTD_count_2segments(ip+4, repMatch+4, iend, repEnd, prefixStart) + 4;
                        int const gain2 = (int)(repLength * 4);
                        int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offBase) + 1);
                        if ((repLength >= 4) && (gain2 > gain1))
                            matchLength = repLength, offBase = REPCODE1_TO_OFFBASE, start = ip;
                }   }

                /* search match, depth 2 */
                {   size_t ofbCandidate = 999999999;
                    size_t const ml2 = ZSTD_searchMax(ms, ip, iend, &ofbCandidate, mls, rowLog, searchMethod, ZSTD_extDict);
                    int const gain2 = (int)(ml2*4 - ZSTD_highbit32((U32)ofbCandidate));   /* raw approx */
                    int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offBase) + 7);
                    if ((ml2 >= 4) && (gain2 > gain1)) {
                        matchLength = ml2, offBase = ofbCandidate, start = ip;
                        continue;
            }   }   }
            break;  /* nothing found : store previous solution */
        }

        /* catch up */
        if (OFFBASE_IS_OFFSET(offBase)) {
            U32 const matchIndex = (U32)((size_t)(start-base) - OFFBASE_TO_OFFSET(offBase));
            const BYTE* match = (matchIndex < dictLimit) ? dictBase + matchIndex : base + matchIndex;
            const BYTE* const mStart = (matchIndex < dictLimit) ? dictStart : prefixStart;
            while ((start>anchor) && (match>mStart) && (start[-1] == match[-1])) { start--; match--; matchLength++; }  /* catch up */
            offset_2 = offset_1; offset_1 = (U32)OFFBASE_TO_OFFSET(offBase);
        }

        /* store sequence */
_storeSequence:
        {   size_t const litLength = (size_t)(start - anchor);
            ZSTD_storeSeq(seqStore, litLength, anchor, iend, (U32)offBase, matchLength);
            anchor = ip = start + matchLength;
        }
        if (ms->lazySkipping) {
            /* We've found a match, disable lazy skipping mode, and refill the hash cache. */
            if (searchMethod == search_rowHash) {
                ZSTD_row_fillHashCache(ms, base, rowLog, mls, ms->nextToUpdate, ilimit);
            }
            ms->lazySkipping = 0;
        }

        /* check immediate repcode */
        while (ip <= ilimit) {
            const U32 repCurrent = (U32)(ip-base);
            const U32 windowLow = ZSTD_getLowestMatchIndex(ms, repCurrent, windowLog);
            const U32 repIndex = repCurrent - offset_2;
            const BYTE* const repBase = repIndex < dictLimit ? dictBase : base;
            const BYTE* const repMatch = repBase + repIndex;
            if ( ((U32)((dictLimit-1) - repIndex) >= 3) /* intentional overflow : do not test positions overlapping 2 memory segments  */
               & (offset_2 <= repCurrent - windowLow) ) /* equivalent to `curr > repIndex >= windowLow` */
            if (MEM_read32(ip) == MEM_read32(repMatch)) {
                /* repcode detected we should take it */
                const BYTE* const repEnd = repIndex < dictLimit ? dictEnd : iend;
                matchLength = ZSTD_count_2segments(ip+4, repMatch+4, iend, repEnd, prefixStart) + 4;
                offBase = offset_2; offset_2 = offset_1; offset_1 = (U32)offBase;   /* swap offset history */
                ZSTD_storeSeq(seqStore, 0, anchor, iend, REPCODE1_TO_OFFBASE, matchLength);
                ip += matchLength;
                anchor = ip;
                continue;   /* faster when present ... (?) */
            }
            break;
    }   }

    /* Save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}